

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumValueOptions::EnumValueOptions(EnumValueOptions *this,Arena *arena)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumValueOptions_0060f030;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_,arena);
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = arena;
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  SharedCtor(this);
  return;
}

Assistant:

EnumValueOptions::EnumValueOptions(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
  _extensions_(arena),
  _internal_metadata_(arena),
  uninterpreted_option_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.EnumValueOptions)
}